

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

HighsTripletPositionSlice * __thiscall presolve::HPresolve::getStoredRow(HPresolve *this)

{
  int *piVar1;
  HighsTripletPositionSlice *this_00;
  HighsInt *in_RSI;
  HighsTripletPositionSlice *in_RDI;
  HighsTripletPositionSlice *pHVar2;
  
  pHVar2 = in_RDI;
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x6f6e85);
  this_00 = (HighsTripletPositionSlice *)
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x6f6e97);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x6f6eac);
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RSI + 0x58))
  ;
  HighsTripletPositionSlice::HighsMatrixSlice(this_00,piVar1,(double *)pHVar2,in_RSI,0);
  return in_RDI;
}

Assistant:

HighsTripletPositionSlice HPresolve::getStoredRow() const {
  return HighsTripletPositionSlice(Acol.data(), Avalue.data(),
                                   rowpositions.data(), rowpositions.size());
}